

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

int row_mt_worker_hook(void *arg1,void *arg2)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  AV1Decoder *in_RSI;
  long *in_RDI;
  AV1DecRowMTSync *dec_row_mt_sync;
  TileDataDec *tile_data_1;
  int mi_row;
  int tile_col;
  int tile_row;
  int end_of_frame;
  AV1DecRowMTJobInfo next_job_info;
  TileDataDec *tile_data;
  TileBufferDec *tile_buffer;
  TileJobsDec *cur_job_info;
  AV1_COMMON *cm;
  AV1DecRowMTInfo *frame_row_mt_info;
  uint8_t allow_update_cdf;
  ThreadData_conflict *td;
  AV1Decoder *pbi;
  DecWorkerData *thread_data;
  undefined7 in_stack_ffffffffffffff68;
  byte bVar4;
  AV1DecTileMT *in_stack_ffffffffffffff70;
  AV1DecRowMTSync *tile;
  TileDataDec *xd;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar5;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  TileInfo *in_stack_ffffffffffffffa0;
  ThreadData_conflict *in_stack_ffffffffffffffa8;
  AV1Decoder *in_stack_ffffffffffffffb0;
  ThreadData_conflict *td_00;
  AV1Decoder *pbi_00;
  undefined7 in_stack_ffffffffffffffc8;
  ThreadData_conflict *td_01;
  uint local_4;
  
  td_01 = (ThreadData_conflict *)*in_RDI;
  pbi_00 = (AV1Decoder *)&in_RSI->frame_row_mt_info;
  (td_01->dcb).corrupted = 0;
  iVar2 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x1d));
  if (iVar2 == 0) {
    *(undefined4 *)(in_RDI + 0x1c) = 1;
    td_00 = (ThreadData_conflict *)&in_RSI->common;
    bVar4 = 0;
    if ((in_RSI->common).tiles.large_scale == 0) {
      bVar4 = (in_RSI->common).features.disable_cdf_update ^ 0xff;
    }
    bVar1 = bVar4 & 1;
    set_decode_func_pointers(td_01,1);
    while (((td_01->dcb).corrupted == 0 &&
           (in_stack_ffffffffffffffb0 = (AV1Decoder *)get_dec_job_info(in_stack_ffffffffffffff70),
           in_stack_ffffffffffffffb0 != (AV1Decoder *)0x0))) {
      in_stack_ffffffffffffffa8 = *(ThreadData_conflict **)&(in_stack_ffffffffffffffb0->dcb).xd;
      in_stack_ffffffffffffffa0 = *(TileInfo **)&(in_stack_ffffffffffffffb0->dcb).xd.mi_stride;
      tile_worker_hook_init
                (in_stack_ffffffffffffffb0,(DecWorkerData *)in_stack_ffffffffffffffa8,
                 (TileBufferDec *)in_stack_ffffffffffffffa0,
                 (TileDataDec *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (uint8_t)((uint)in_stack_ffffffffffffff94 >> 0x18));
      pthread_mutex_lock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
      in_stack_ffffffffffffffa0[0x37b].tile_row = in_stack_ffffffffffffffa0[0x37b].tile_row + 1;
      pthread_mutex_unlock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
      parse_tile_row_mt(pbi_00,td_00,(TileDataDec *)in_stack_ffffffffffffffb0);
      pthread_mutex_lock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
      in_stack_ffffffffffffffa0[0x37b].tile_row = in_stack_ffffffffffffffa0[0x37b].tile_row + -1;
      pthread_mutex_unlock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
    }
    if ((td_01->dcb).corrupted == 0) {
      set_decode_func_pointers(td_01,2);
      while( true ) {
        iVar5 = 0;
        pthread_mutex_lock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
        iVar2 = in_stack_ffffffffffffff9c;
        while (iVar3 = get_next_job_info(in_RSI,(AV1DecRowMTJobInfo *)td_01,
                                         (int *)CONCAT17(bVar1,in_stack_ffffffffffffffc8)),
              iVar3 == 0) {
          pthread_cond_wait((pthread_cond_t *)in_RSI->row_mt_cond_,
                            (pthread_mutex_t *)in_RSI->row_mt_mutex_);
        }
        pthread_mutex_unlock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
        if (iVar5 != 0) break;
        xd = in_RSI->tile_data +
             (long)(in_stack_ffffffffffffff94 * (td_00->cb_buffer_base).dqcoeff[0][0x950]) +
             (long)in_stack_ffffffffffffff98;
        tile = &xd->dec_row_mt_sync;
        in_stack_ffffffffffffff9c = iVar2;
        av1_tile_init((TileInfo *)tile,(AV1_COMMON *)CONCAT17(bVar4,in_stack_ffffffffffffff68),0,
                      0x1bb7d9);
        av1_init_macroblockd
                  ((AV1_COMMON *)CONCAT44(iVar2,in_stack_ffffffffffffff80),(MACROBLOCKD *)xd);
        (td_01->dcb).xd.error_info = (aom_internal_error_info *)(in_RDI + 2);
        decode_tile_sb_row(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        pthread_mutex_lock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
        tile->num_threads_working = tile->num_threads_working + -1;
        pthread_mutex_unlock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
      }
      *(undefined4 *)(in_RDI + 0x1c) = 0;
      local_4 = (uint)(((td_01->dcb).corrupted != 0 ^ 0xffU) & 1);
    }
    else {
      *(undefined4 *)(in_RDI + 0x1c) = 0;
      pthread_mutex_lock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
      *(undefined4 *)((long)&(pbi_00->dcb).xd.plane[0].dst.buf + 4) = 1;
      pthread_cond_broadcast((pthread_cond_t *)in_RSI->row_mt_cond_);
      pthread_mutex_unlock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
      local_4 = 0;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x1c) = 0;
    *(undefined4 *)(*in_RDI + 0x3ad0) = 1;
    pthread_mutex_lock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
    *(undefined4 *)((long)&(pbi_00->dcb).xd.plane[0].dst.buf + 4) = 1;
    pthread_cond_broadcast((pthread_cond_t *)in_RSI->row_mt_cond_);
    pthread_mutex_unlock((pthread_mutex_t *)in_RSI->row_mt_mutex_);
    signal_decoding_done_for_erroneous_row
              ((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int row_mt_worker_hook(void *arg1, void *arg2) {
  DecWorkerData *const thread_data = (DecWorkerData *)arg1;
  AV1Decoder *const pbi = (AV1Decoder *)arg2;
  ThreadData *const td = thread_data->td;
  uint8_t allow_update_cdf;
  AV1DecRowMTInfo *frame_row_mt_info = &pbi->frame_row_mt_info;
  td->dcb.corrupted = 0;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(thread_data->error_info.jmp)) {
    thread_data->error_info.setjmp = 0;
    thread_data->td->dcb.corrupted = 1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    frame_row_mt_info->row_mt_exit = 1;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(pbi->row_mt_cond_);
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    // If any SB row (erroneous row) processed by a thread encounters an
    // internal error, there is a need to indicate other threads that decoding
    // of the erroneous row is complete. This ensures that other threads which
    // wait upon the completion of SB's present in erroneous row are not waiting
    // indefinitely.
    signal_decoding_done_for_erroneous_row(pbi, &thread_data->td->dcb.xd);
    return 0;
  }
  thread_data->error_info.setjmp = 1;

  AV1_COMMON *cm = &pbi->common;
  allow_update_cdf = cm->tiles.large_scale ? 0 : 1;
  allow_update_cdf = allow_update_cdf && !cm->features.disable_cdf_update;

  set_decode_func_pointers(td, 0x1);

  assert(cm->tiles.cols > 0);
  while (!td->dcb.corrupted) {
    TileJobsDec *cur_job_info = get_dec_job_info(&pbi->tile_mt_info);

    if (cur_job_info != NULL) {
      const TileBufferDec *const tile_buffer = cur_job_info->tile_buffer;
      TileDataDec *const tile_data = cur_job_info->tile_data;
      tile_worker_hook_init(pbi, thread_data, tile_buffer, tile_data,
                            allow_update_cdf);
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
      tile_data->dec_row_mt_sync.num_threads_working++;
#if CONFIG_MULTITHREAD
      pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
      // decode tile
      parse_tile_row_mt(pbi, td, tile_data);
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
      tile_data->dec_row_mt_sync.num_threads_working--;
#if CONFIG_MULTITHREAD
      pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    } else {
      break;
    }
  }

  if (td->dcb.corrupted) {
    thread_data->error_info.setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    frame_row_mt_info->row_mt_exit = 1;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(pbi->row_mt_cond_);
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    return 0;
  }

  set_decode_func_pointers(td, 0x2);

  while (1) {
    AV1DecRowMTJobInfo next_job_info;
    int end_of_frame = 0;

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    while (!get_next_job_info(pbi, &next_job_info, &end_of_frame)) {
#if CONFIG_MULTITHREAD
      pthread_cond_wait(pbi->row_mt_cond_, pbi->row_mt_mutex_);
#endif
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif

    if (end_of_frame) break;

    int tile_row = next_job_info.tile_row;
    int tile_col = next_job_info.tile_col;
    int mi_row = next_job_info.mi_row;

    TileDataDec *tile_data =
        pbi->tile_data + tile_row * cm->tiles.cols + tile_col;
    AV1DecRowMTSync *dec_row_mt_sync = &tile_data->dec_row_mt_sync;

    av1_tile_init(&td->dcb.xd.tile, cm, tile_row, tile_col);
    av1_init_macroblockd(cm, &td->dcb.xd);
    td->dcb.xd.error_info = &thread_data->error_info;

    decode_tile_sb_row(pbi, td, &tile_data->tile_info, mi_row);

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    dec_row_mt_sync->num_threads_working--;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
  }
  thread_data->error_info.setjmp = 0;
  return !td->dcb.corrupted;
}